

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O1

bool __thiscall
UnifiedRegex::Matcher::PopAssertion
          (Matcher *this,CharCount *inputOffset,uint8 **instPointer,ContStack *contStack,
          AssertionStack *assertionStack,bool succeeded)

{
  size_t *psVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  code *pcVar6;
  bool bVar7;
  undefined4 *puVar8;
  int i;
  int iVar9;
  uint *puVar10;
  ulong uVar11;
  
  uVar11 = (assertionStack->
           super_ContinuousPageStackOfFixedElements<UnifiedRegex::AssertionInfo,_1UL>).
           super_ContinuousPageStack<1UL>.nextTop;
  if (uVar11 == 0) {
    puVar10 = (uint *)0x0;
  }
  else {
    if (uVar11 < 0x10) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/ContinuousPageStack.h"
                         ,0xf0,"(size <= nextTop)","size <= nextTop");
      if (!bVar7) goto LAB_00f066c9;
      *puVar8 = 0;
    }
    if ((assertionStack->super_ContinuousPageStackOfFixedElements<UnifiedRegex::AssertionInfo,_1UL>)
        .super_ContinuousPageStack<1UL>.bufferSize == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/ContinuousPageStack.h"
                         ,199,"(bufferSize)","bufferSize");
      if (!bVar7) goto LAB_00f066c9;
      *puVar8 = 0;
    }
    puVar10 = (uint *)((long)&((assertionStack->
                               super_ContinuousPageStackOfFixedElements<UnifiedRegex::AssertionInfo,_1UL>
                               ).super_ContinuousPageStack<1UL>.pageAllocation)->pageCount +
                      (assertionStack->
                      super_ContinuousPageStackOfFixedElements<UnifiedRegex::AssertionInfo,_1UL>).
                      super_ContinuousPageStack<1UL>.nextTop);
  }
  if (puVar10 == (uint *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                       ,0xce,"(info != 0)","info != 0");
    if (!bVar7) goto LAB_00f066c9;
    *puVar8 = 0;
  }
  uVar11 = (assertionStack->
           super_ContinuousPageStackOfFixedElements<UnifiedRegex::AssertionInfo,_1UL>).
           super_ContinuousPageStack<1UL>.nextTop;
  if (uVar11 != 0) {
    if (uVar11 < 0x10) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/ContinuousPageStack.h"
                         ,0xfd,"(nextTop >= size)","nextTop >= size");
      if (!bVar7) goto LAB_00f066c9;
      *puVar8 = 0;
    }
    psVar1 = &(assertionStack->
              super_ContinuousPageStackOfFixedElements<UnifiedRegex::AssertionInfo,_1UL>).
              super_ContinuousPageStack<1UL>.nextTop;
    *psVar1 = *psVar1 - 0x10;
    if ((assertionStack->super_ContinuousPageStackOfFixedElements<UnifiedRegex::AssertionInfo,_1UL>)
        .super_ContinuousPageStack<1UL>.bufferSize == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/ContinuousPageStack.h"
                         ,199,"(bufferSize)","bufferSize");
      if (!bVar7) goto LAB_00f066c9;
      *puVar8 = 0;
    }
  }
  uVar11 = (ulong)*puVar10;
  if ((ulong)(((this->program).ptr)->rep).insts.instsLen < uVar11 + 0xe) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                       ,0x774,"(label + sizeof(T) <= program->rep.insts.instsLen)",
                       "label + sizeof(T) <= program->rep.insts.instsLen");
    if (!bVar7) goto LAB_00f066c9;
    *puVar8 = 0;
  }
  if ((((this->program).ptr)->rep).insts.insts.ptr[uVar11] != 'b') {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                       ,0x775,"(((Inst*)(program->rep.insts.insts + label))->tag == tag)",
                       "((Inst*)(program->rep.insts.insts + label))->tag == tag");
    if (!bVar7) goto LAB_00f066c9;
    *puVar8 = 0;
  }
  lVar5 = *(long *)&((this->program).ptr)->rep;
  if (this->w != (DebugWriter *)0x0) {
    DebugWriter::PrintEOL(this->w,L"POP TO %llu",*(undefined8 *)(puVar10 + 2));
  }
  ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>::PopTo
            (&contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>,
             *(size_t *)(puVar10 + 2));
  if ((succeeded) && (*(char *)(lVar5 + 9 + uVar11) == '\x01')) {
    iVar9 = *(int *)(lVar5 + 1 + uVar11);
    iVar3 = *(int *)(lVar5 + 5 + uVar11);
    if (iVar9 <= iVar3) {
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      do {
        if ((iVar9 < 0) || ((int)(uint)((this->program).ptr)->numGroups <= iVar9)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar8 = 1;
          bVar7 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                             ,0x782,"(groupId >= 0 && groupId < program->numGroups)",
                             "groupId >= 0 && groupId < program->numGroups");
          if (!bVar7) goto LAB_00f066c9;
          *puVar8 = 0;
        }
        (this->groupInfos).ptr[iVar9].length = 0xffffffff;
        iVar9 = iVar9 + 1;
      } while (iVar9 <= iVar3);
    }
  }
  cVar2 = *(char *)(lVar5 + 9 + uVar11);
  if ((bool)cVar2 != succeeded) {
    *inputOffset = puVar10[1];
    uVar4 = *(uint *)(lVar5 + 10 + uVar11);
    if ((((this->program).ptr)->rep).insts.instsLen <= uVar4) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                         ,0x76d,"(label < program->rep.insts.instsLen)",
                         "label < program->rep.insts.instsLen");
      if (!bVar7) {
LAB_00f066c9:
        pcVar6 = (code *)invalidInstructionException();
        (*pcVar6)();
      }
      *puVar8 = 0;
    }
    *instPointer = (((this->program).ptr)->rep).insts.insts.ptr + uVar4;
  }
  return (bool)cVar2 != succeeded;
}

Assistant:

inline bool Matcher::PopAssertion(CharCount &inputOffset, const uint8 *&instPointer, ContStack &contStack, AssertionStack &assertionStack, bool succeeded)
    {
        AssertionInfo* info = assertionStack.Top();
        Assert(info != 0);
        assertionStack.Pop();
        BeginAssertionInst* begin = L2I(BeginAssertion, info->beginLabel);

        // Cut the existing continuations (we never backtrack into an assertion)
        // NOTE: We don't include the effective pops in the stats
#if ENABLE_REGEX_CONFIG_OPTIONS
        if (w != 0)
        {
            w->PrintEOL(_u("POP TO %llu"), (unsigned long long)info->contStackPosition);
        }
#endif
        contStack.PopTo(info->contStackPosition);

        // succeeded  isNegation  action
        // ---------  ----------  ----------------------------------------------------------------------------------
        // false      false       Fail into outer continuations (inner group bindings will have been undone)
        // true       false       Jump to next label (inner group bindings are now frozen)
        // false      true        Jump to next label (inner group bindings will have been undone and are now frozen)
        // true       true        Fail into outer continuations (inner group binding MUST BE CLEARED)

        if (succeeded && begin->isNegation)
        {
            ResetInnerGroups(begin->minBodyGroupId, begin->maxBodyGroupId);
        }

        if (succeeded == begin->isNegation)
        {
            // Assertion failed
            return false;
        }
        else
        {
            // Continue with next label but from original input position
            inputOffset = info->startInputOffset;
            instPointer = LabelToInstPointer(begin->nextLabel);

            return true;
        }
    }